

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int coda_read_product_definition(coda_product_definition *product_definition)

{
  coda_product_class *current_product_class;
  int iVar1;
  za_file *zf_00;
  za_file *zf;
  coda_product_class *product_class;
  coda_product_definition *product_definition_local;
  
  if (product_definition->initialized == 0) {
    current_product_class = product_definition->product_type->product_class;
    zf_00 = coda_za_open(current_product_class->definition_file,handle_ziparchive_error);
    if (zf_00 == (za_file *)0x0) {
      product_definition_local._4_4_ = -1;
    }
    else {
      iVar1 = parse_entry(zf_00,ze_product,product_definition->name,current_product_class,
                          product_definition);
      if (iVar1 == 0) {
        coda_za_close(zf_00);
        product_definition_local._4_4_ = 0;
      }
      else {
        coda_za_close(zf_00);
        product_definition_local._4_4_ = -1;
      }
    }
    return product_definition_local._4_4_;
  }
  __assert_fail("!product_definition->initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                ,0x10b2,"int coda_read_product_definition(coda_product_definition *)");
}

Assistant:

int coda_read_product_definition(coda_product_definition *product_definition)
{
    coda_product_class *product_class;
    za_file *zf;

    assert(!product_definition->initialized);

    product_class = product_definition->product_type->product_class;

    zf = za_open(product_class->definition_file, handle_ziparchive_error);
    if (zf == NULL)
    {
        return -1;
    }
    if (parse_entry(zf, ze_product, product_definition->name, product_class, product_definition) != 0)
    {
        za_close(zf);
        return -1;
    }
    za_close(zf);

    return 0;
}